

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone.c
# Opt level: O3

int findPendingSignal(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *pVVar1;
  char *pcVar2;
  long lVar3;
  
  pVVar1 = pNtk->vPos;
  if (0 < pVVar1->nSize) {
    lVar3 = 0;
    do {
      pcVar2 = Abc_ObjName((Abc_Obj_t *)pVVar1->pArray[lVar3]);
      pcVar2 = strstr(pcVar2,"pendingSignal");
      if (pcVar2 != (char *)0x0) {
        return (int)lVar3;
      }
      lVar3 = lVar3 + 1;
      pVVar1 = pNtk->vPos;
    } while (lVar3 < pVVar1->nSize);
  }
  return -1;
}

Assistant:

int findPendingSignal(Abc_Ntk_t *pNtk)
{
	int i, pendingSignalIndex = -1;
	Abc_Obj_t *pNode;

	Abc_NtkForEachPo( pNtk, pNode, i )
	{
		if( strstr( Abc_ObjName( pNode ), "pendingSignal" ) != NULL )
		{
			pendingSignalIndex = i;
			break;
		}
	}	
	
	return pendingSignalIndex;
}